

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cpp
# Opt level: O2

void __thiscall higan::EventLoopThread::EventLoopThread(EventLoopThread *this,string *name)

{
  _Bind<void_(higan::EventLoop::*(higan::EventLoop_*))()> local_60;
  ThreadFunc local_48;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  EventLoop::EventLoop(&this->loop_);
  local_60._M_f = (offset_in_EventLoop_to_subr)EventLoop::Loop;
  local_60._8_8_ = 0;
  local_60._M_bound_args.super__Tuple_impl<0UL,_higan::EventLoop_*>.
  super__Head_base<0UL,_higan::EventLoop_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_higan::EventLoop_*>)(_Tuple_impl<0UL,_higan::EventLoop_*>)&this->loop_;
  std::function<void()>::function<std::_Bind<void(higan::EventLoop::*(higan::EventLoop*))()>,void>
            ((function<void()> *)&local_48,&local_60);
  Thread::Thread(&this->thread_,&this->name_,&local_48);
  std::_Function_base::~_Function_base(&local_48.super__Function_base);
  Thread::Start(&this->thread_);
  return;
}

Assistant:

EventLoopThread::EventLoopThread(const std::string& name):
		name_(name),
		loop_(),
		thread_(name_, std::bind(&EventLoop::Loop, &loop_))
{
	thread_.Start();
}